

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int mz_deflateReset(mz_streamp pStream)

{
  void *in_RDI;
  tdefl_compressor *unaff_retaddr;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if ((((in_RDI == (void *)0x0) || (*(long *)((long)in_RDI + 0x38) == 0)) ||
      (*(long *)((long)in_RDI + 0x40) == 0)) || (*(long *)((long)in_RDI + 0x48) == 0)) {
    iVar1 = -2;
  }
  else {
    *(undefined8 *)((long)in_RDI + 0x28) = 0;
    *(undefined8 *)((long)in_RDI + 0x10) = 0;
    tdefl_init(unaff_retaddr,
               (tdefl_put_buf_func_ptr)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
               ,in_RDI,in_stack_ffffffffffffffec);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mz_deflateReset(mz_streamp pStream) {
  if ((!pStream) || (!pStream->state) || (!pStream->zalloc) ||
      (!pStream->zfree))
    return MZ_STREAM_ERROR;
  pStream->total_in = pStream->total_out = 0;
  tdefl_init((tdefl_compressor *)pStream->state, NULL, NULL,
             ((tdefl_compressor *)pStream->state)->m_flags);
  return MZ_OK;
}